

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Cues::~Cues(Cues *this)

{
  CuePoint **ppCVar1;
  long lVar2;
  long lVar3;
  CuePoint *this_00;
  long lVar4;
  
  ppCVar1 = this->m_cue_points;
  lVar2 = this->m_count;
  lVar3 = this->m_preload_count;
  lVar4 = 0;
  while( true ) {
    if (lVar3 * 8 + lVar2 * 8 == lVar4) {
      if (this->m_cue_points != (CuePoint **)0x0) {
        operator_delete__(this->m_cue_points);
        return;
      }
      return;
    }
    this_00 = *(CuePoint **)((long)ppCVar1 + lVar4);
    if (this_00 == (CuePoint *)0x0) break;
    CuePoint::~CuePoint(this_00);
    operator_delete(this_00);
    lVar4 = lVar4 + 8;
  }
  __assert_fail("pCP",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0x739,"mkvparser::Cues::~Cues()");
}

Assistant:

Cues::~Cues() {
  const long n = m_count + m_preload_count;

  CuePoint** p = m_cue_points;
  CuePoint** const q = p + n;

  while (p != q) {
    CuePoint* const pCP = *p++;
    assert(pCP);

    delete pCP;
  }

  delete[] m_cue_points;
}